

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::SetBox(Element *this,Box *box)

{
  Vector2f VVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  float value;
  float fVar8;
  BoxEdge local_68 [6];
  String local_50;
  
  bVar6 = Box::operator!=(box,&this->main_box);
  if ((bVar6) ||
     ((this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    local_68[0] = Top;
    local_68[1] = Right;
    local_68[2] = Bottom;
    local_68[3] = Left;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
      value = Box::GetEdge(box,Border,*(BoxEdge *)((long)local_68 + lVar7));
      fVar8 = Math::Round(value);
      if ((value != fVar8) || (NAN(value) || NAN(fVar8))) {
        GetAddress_abi_cxx11_(&local_50,this,false,true);
        Log::Message(LT_WARNING,"Expected integer border width but got %g px on element: %s",
                     SUB84((double)value,0),local_50._M_dataplus._M_p);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    *(undefined8 *)((this->main_box).area_edges[2] + 2) = *(undefined8 *)(box->area_edges[2] + 2);
    VVar1 = box->content;
    uVar2 = *(undefined8 *)box->area_edges[0];
    uVar3 = *(undefined8 *)(box->area_edges[0] + 2);
    uVar4 = *(undefined8 *)box->area_edges[1];
    uVar5 = *(undefined8 *)box->area_edges[2];
    *(undefined8 *)((this->main_box).area_edges[1] + 2) = *(undefined8 *)(box->area_edges[1] + 2);
    *(undefined8 *)(this->main_box).area_edges[2] = uVar5;
    *(undefined8 *)((this->main_box).area_edges[0] + 2) = uVar3;
    *(undefined8 *)(this->main_box).area_edges[1] = uVar4;
    (this->main_box).content = VVar1;
    *(undefined8 *)(this->main_box).area_edges[0] = uVar2;
    ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::clear
              (&this->additional_boxes);
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])(this);
    this->field_0x17 = this->field_0x17 | 1;
    ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
    ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
    ElementEffects::DirtyEffectsData(&this->meta->effects);
  }
  return;
}

Assistant:

void Element::SetBox(const Box& box)
{
	if (box != main_box || additional_boxes.size() > 0)
	{
#ifdef RMLUI_DEBUG
		for (const BoxEdge edge : {BoxEdge::Top, BoxEdge::Right, BoxEdge::Bottom, BoxEdge::Left})
		{
			const float border_width = box.GetEdge(BoxArea::Border, edge);
			if (border_width != Math::Round(border_width))
				Log::Message(Log::LT_WARNING, "Expected integer border width but got %g px on element: %s", border_width, GetAddress().c_str());
		}
#endif

		main_box = box;
		additional_boxes.clear();

		OnResize();
		rounded_main_padding_size_dirty = true;
		meta->background_border.DirtyBackground();
		meta->background_border.DirtyBorder();
		meta->effects.DirtyEffectsData();
	}
}